

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int quicly_decrypt_address_token
              (ptls_aead_context_t *aead,quicly_address_token_plaintext_t *plaintext,void *_token,
              size_t len,size_t prefix_len,char **err_desc)

{
  in_addr_t *piVar1;
  byte bVar2;
  st_ptls_aead_algorithm_t *psVar3;
  undefined8 uVar4;
  bool bVar5;
  in_addr_t iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  anon_enum_32 aVar12;
  long lVar13;
  ulong uVar14;
  char **ppcVar15;
  in_port_t *piVar16;
  size_t sVar17;
  in_addr_t *end;
  uint8_t *src;
  uint16_t port;
  uint8_t ptbuf [1200];
  in_addr_t *local_500;
  ushort local_4f2;
  char **local_4f0;
  in_addr_t local_4e8 [302];
  
  *err_desc = (char *)0x0;
  psVar3 = aead->algo;
  lVar13 = psVar3->iv_size + prefix_len + 1;
  if (len < lVar13 + psVar3->tag_size) {
    pcVar10 = "token too small";
LAB_0012e1a1:
    *err_desc = pcVar10;
    return 0x32;
  }
  if (lVar13 + psVar3->tag_size + 0x4b0 < len) {
    pcVar10 = "token too large";
    goto LAB_0012e1a1;
  }
  bVar2 = *(byte *)((long)_token + prefix_len);
  aVar12 = (anon_enum_32)bVar2;
  if (bVar2 != 0) {
    if (bVar2 != 1) {
      pcVar10 = "unknown token type";
      goto LAB_0012e1a1;
    }
    aVar12 = QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION;
  }
  plaintext->type = aVar12;
  local_4f0 = err_desc;
  (*psVar3->setup_crypto)(aead,0,(void *)0x0,(void *)((long)_token + prefix_len + 1));
  sVar11 = aead->algo->iv_size;
  sVar17 = prefix_len + 1 + sVar11;
  piVar16 = (in_port_t *)(len - sVar17);
  sVar11 = (*aead->do_decrypt)(aead,local_4e8,(void *)((long)_token + sVar11 + prefix_len + 1),
                               (size_t)piVar16,0,_token,sVar17);
  if (sVar11 == 0xffffffffffffffff) {
    *local_4f0 = "token decryption failure";
    ppcVar15 = local_4f0;
    iVar7 = 0x33;
    goto LAB_0012e1d4;
  }
  end = (in_addr_t *)((long)local_4e8 + sVar11);
  local_500 = local_4e8;
  iVar7 = ptls_decode64(&plaintext->issued_at,(uint8_t **)&local_500,(uint8_t *)end);
  ppcVar15 = local_4f0;
  if (iVar7 != 0) goto LAB_0012e1d4;
  iVar8 = 3;
  iVar7 = 0x32;
  piVar1 = local_500;
  if (end == local_500) {
LAB_0012e1fa:
    local_500 = piVar1;
    bVar5 = false;
  }
  else {
    piVar1 = (in_addr_t *)((long)local_500 + 1);
    uVar14 = (ulong)(byte)*local_500;
    if ((ulong)((long)end - (long)piVar1) < uVar14) goto LAB_0012e1fa;
    if (uVar14 == 0x10) {
      (plaintext->remote).sa.sa_family = 10;
      uVar4 = *(undefined8 *)((long)local_500 + 9);
      *(undefined8 *)((long)&plaintext->remote + 8) = *(undefined8 *)piVar1;
      *(undefined8 *)((long)&plaintext->remote + 0x10) = uVar4;
    }
    else {
      if ((byte)*local_500 != 4) goto LAB_0012e1fa;
      (plaintext->remote).sa.sa_family = 2;
      (plaintext->remote).sin.sin_addr.s_addr = *piVar1;
    }
    local_500 = (in_addr_t *)((long)piVar1 + uVar14);
    piVar16 = &(plaintext->remote).sin.sin_port;
    bVar5 = true;
    iVar7 = 0;
    iVar8 = 0;
  }
  if (bVar5) {
    iVar7 = ptls_decode16(&local_4f2,(uint8_t **)&local_500,(uint8_t *)end);
    iVar8 = 3;
    if (iVar7 == 0) {
      *piVar16 = local_4f2 << 8 | local_4f2 >> 8;
      iVar8 = 0;
    }
  }
  if (iVar8 == 3) goto LAB_0012e1d4;
  if (iVar8 != 0) {
    return 0;
  }
  if (plaintext->type == QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION) {
    iVar9 = 3;
    iVar8 = 0x32;
    if (end != local_500) {
      piVar1 = (in_addr_t *)((long)local_500 + 1);
      uVar14 = (ulong)(byte)*local_500;
      local_500 = piVar1;
      if (uVar14 <= (ulong)((long)end - (long)piVar1)) {
        (plaintext->field_4).resumption.len = uVar14;
        memcpy(&plaintext->field_4,piVar1,uVar14);
        iVar9 = 0;
        iVar8 = iVar7;
        local_500 = (in_addr_t *)((long)piVar1 + uVar14);
      }
    }
  }
  else {
    if (plaintext->type != QUICLY_ADDRESS_TOKEN_TYPE_RETRY) {
      __assert_fail("!\"unexpected token type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0x185d,
                    "int quicly_decrypt_address_token(ptls_aead_context_t *, quicly_address_token_plaintext_t *, const void *, size_t, size_t, const char **)"
                   );
    }
    iVar9 = 3;
    iVar8 = 0x32;
    if (end != local_500) {
      piVar1 = (in_addr_t *)((long)local_500 + 1);
      iVar6 = *local_500;
      uVar14 = (ulong)(byte)iVar6;
      local_500 = piVar1;
      if ((uVar14 < 0x15) && (uVar14 <= (ulong)((long)end - (long)piVar1))) {
        memcpy(&plaintext->field_4,piVar1,uVar14);
        (plaintext->field_4).retry.original_dcid.len = (byte)iVar6;
        iVar9 = 0;
        iVar8 = iVar7;
        local_500 = (in_addr_t *)((long)piVar1 + uVar14);
      }
    }
    iVar7 = iVar8;
    if (iVar9 == 3) goto LAB_0012e1d4;
    if (iVar9 != 0) {
      return iVar8;
    }
    iVar9 = 3;
    iVar7 = 0x32;
    if (end != local_500) {
      piVar1 = (in_addr_t *)((long)local_500 + 1);
      iVar6 = *local_500;
      uVar14 = (ulong)(byte)iVar6;
      local_500 = piVar1;
      if ((uVar14 < 0x15) && (uVar14 <= (ulong)((long)end - (long)piVar1))) {
        memcpy((void *)((long)&plaintext->field_4 + 0x15),piVar1,uVar14);
        (plaintext->field_4).retry.client_cid.len = (byte)iVar6;
        iVar9 = 0;
        iVar7 = iVar8;
        local_500 = (in_addr_t *)((long)piVar1 + uVar14);
      }
    }
    if (iVar9 == 3) goto LAB_0012e1d4;
    if (iVar9 != 0) {
      return iVar8;
    }
    iVar9 = 3;
    iVar8 = 0x32;
    if (end != local_500) {
      piVar1 = (in_addr_t *)((long)local_500 + 1);
      iVar6 = *local_500;
      uVar14 = (ulong)(byte)iVar6;
      local_500 = piVar1;
      if ((uVar14 < 0x15) && (uVar14 <= (ulong)((long)end - (long)piVar1))) {
        memcpy((void *)((long)&plaintext->field_4 + 0x2a),piVar1,uVar14);
        (plaintext->field_4).retry.server_cid.len = (byte)iVar6;
        iVar9 = 0;
        iVar8 = iVar7;
        local_500 = (in_addr_t *)((long)piVar1 + uVar14);
      }
    }
  }
  if (iVar9 == 0) {
    iVar9 = 3;
    iVar7 = 0x32;
    if (end != local_500) {
      piVar1 = (in_addr_t *)((long)local_500 + 1);
      uVar14 = (ulong)(byte)*local_500;
      local_500 = piVar1;
      if (uVar14 <= (ulong)((long)end - (long)piVar1)) {
        (plaintext->appdata).len = uVar14;
        memcpy(&plaintext->appdata,piVar1,uVar14);
        iVar9 = 0;
        iVar7 = iVar8;
        local_500 = (in_addr_t *)((long)piVar1 + uVar14);
      }
    }
    if (iVar9 != 3) {
      if (iVar9 != 0) {
        return iVar7;
      }
      iVar7 = 0x32;
      if (local_500 == end) {
        iVar7 = 0;
      }
    }
  }
  else {
    iVar7 = iVar8;
    if (iVar9 != 3) {
      return iVar8;
    }
  }
LAB_0012e1d4:
  if (iVar7 == 0) {
    return 0;
  }
  if (*ppcVar15 == (char *)0x0) {
    *ppcVar15 = "token decode error";
  }
  if (plaintext->type != QUICLY_ADDRESS_TOKEN_TYPE_RETRY) {
    return iVar7;
  }
  return 0x2000b;
}

Assistant:

int quicly_decrypt_address_token(ptls_aead_context_t *aead, quicly_address_token_plaintext_t *plaintext, const void *_token,
                                 size_t len, size_t prefix_len, const char **err_desc)
{
    const uint8_t *const token = _token;
    uint8_t ptbuf[QUICLY_MIN_CLIENT_INITIAL_SIZE];
    size_t ptlen;

    *err_desc = NULL;

    /* check if we can get type and decrypt */
    if (len < prefix_len + 1 + aead->algo->iv_size + aead->algo->tag_size) {
        *err_desc = "token too small";
        return PTLS_ALERT_DECODE_ERROR;
    }
    if (prefix_len + 1 + aead->algo->iv_size + sizeof(ptbuf) + aead->algo->tag_size < len) {
        *err_desc = "token too large";
        return PTLS_ALERT_DECODE_ERROR;
    }

    /* check type */
    switch (token[prefix_len]) {
    case QUICLY_ADDRESS_TOKEN_TYPE_RETRY:
        plaintext->type = QUICLY_ADDRESS_TOKEN_TYPE_RETRY;
        break;
    case QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION:
        plaintext->type = QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION;
        break;
    default:
        *err_desc = "unknown token type";
        return PTLS_ALERT_DECODE_ERROR;
    }

    /* `goto Exit` can only happen below this line, and that is guaranteed by declaring `ret` here */
    int ret;

    /* decrypt */
    aead->algo->setup_crypto(aead, 0, NULL, token + prefix_len + 1);
    if ((ptlen = ptls_aead_decrypt(aead, ptbuf, token + prefix_len + 1 + aead->algo->iv_size,
                                   len - (prefix_len + 1 + aead->algo->iv_size), 0, token, prefix_len + 1 + aead->algo->iv_size)) ==
        SIZE_MAX) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        *err_desc = "token decryption failure";
        goto Exit;
    }

    /* parse */
    const uint8_t *src = ptbuf, *end = src + ptlen;
    if ((ret = ptls_decode64(&plaintext->issued_at, &src, end)) != 0)
        goto Exit;
    {
        in_port_t *portaddr;
        ptls_decode_open_block(src, end, 1, {
            switch (end - src) {
            case 4: /* ipv4 */
                plaintext->remote.sin.sin_family = AF_INET;
                memcpy(&plaintext->remote.sin.sin_addr.s_addr, src, 4);
                portaddr = &plaintext->remote.sin.sin_port;
                break;
            case 16: /* ipv6 */
                plaintext->remote.sin6.sin6_family = AF_INET6;
                memcpy(&plaintext->remote.sin6.sin6_addr, src, 16);
                portaddr = &plaintext->remote.sin6.sin6_port;
                break;
            default:
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            src = end;
        });
        uint16_t port;
        if ((ret = ptls_decode16(&port, &src, end)) != 0)
            goto Exit;
        *portaddr = htons(port);
    }
    switch (plaintext->type) {
    case QUICLY_ADDRESS_TOKEN_TYPE_RETRY:
#define DECODE_CID(field)                                                                                                          \
    do {                                                                                                                           \
        ptls_decode_open_block(src, end, 1, {                                                                                      \
            if (end - src > sizeof(plaintext->retry.field.cid)) {                                                                  \
                ret = PTLS_ALERT_DECODE_ERROR;                                                                                     \
                goto Exit;                                                                                                         \
            }                                                                                                                      \
            quicly_set_cid(&plaintext->retry.field, ptls_iovec_init(src, end - src));                                              \
            src = end;                                                                                                             \
        });                                                                                                                        \
    } while (0)
        DECODE_CID(original_dcid);
        DECODE_CID(client_cid);
        DECODE_CID(server_cid);
#undef DECODE_CID
        break;
    case QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION:
        ptls_decode_open_block(src, end, 1, {
            PTLS_BUILD_ASSERT(sizeof(plaintext->resumption.bytes) >= 256);
            plaintext->resumption.len = end - src;
            memcpy(plaintext->resumption.bytes, src, plaintext->resumption.len);
            src = end;
        });
        break;
    default:
        assert(!"unexpected token type");
        abort();
    }
    ptls_decode_block(src, end, 1, {
        PTLS_BUILD_ASSERT(sizeof(plaintext->appdata.bytes) >= 256);
        plaintext->appdata.len = end - src;
        memcpy(plaintext->appdata.bytes, src, plaintext->appdata.len);
        src = end;
    });
    ret = 0;

Exit:
    if (ret != 0) {
        if (*err_desc == NULL)
            *err_desc = "token decode error";
        /* promote the error to one that triggers the emission of INVALID_TOKEN_ERROR, if the token looked like a retry */
        if (plaintext->type == QUICLY_ADDRESS_TOKEN_TYPE_RETRY)
            ret = QUICLY_TRANSPORT_ERROR_INVALID_TOKEN;
    }
    return ret;
}